

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

bool __thiscall Json::Value::operator==(Value *this,Value *other)

{
  ushort uVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint *__s;
  uint *__s_00;
  size_t sVar7;
  
  uVar1 = *(ushort *)&other->bits_;
  cVar2 = (char)*(ushort *)&this->bits_;
  if ((char)uVar1 != cVar2) goto LAB_00128641;
  switch(cVar2) {
  case '\0':
    bVar3 = true;
    break;
  case '\x01':
  case '\x02':
    bVar3 = (this->value_).int_ == (other->value_).int_;
    break;
  case '\x03':
    bVar3 = (bool)(-((other->value_).real_ == (this->value_).real_) & 1);
    break;
  case '\x04':
    __s = (uint *)(this->value_).string_;
    __s_00 = (uint *)(other->value_).string_;
    if (__s_00 == (uint *)0x0 || __s == (uint *)0x0) {
      return __s == __s_00;
    }
    if ((*(ushort *)&this->bits_ >> 8 & 1) == 0) {
      sVar7 = strlen((char *)__s);
      uVar4 = (uint)sVar7;
    }
    else {
      uVar4 = *__s;
      __s = __s + 1;
    }
    if ((uVar1 >> 8 & 1) == 0) {
      sVar7 = strlen((char *)__s_00);
      uVar5 = (uint)sVar7;
    }
    else {
      uVar5 = *__s_00;
      __s_00 = __s_00 + 1;
    }
    if (uVar4 == uVar5) {
      iVar6 = memcmp(__s,__s_00,(ulong)uVar4);
      return iVar6 == 0;
    }
    goto LAB_00128641;
  case '\x05':
    bVar3 = (this->value_).bool_ == (other->value_).bool_;
    break;
  case '\x06':
  case '\a':
    if ((((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count ==
        (((other->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
      bVar3 = std::operator==(&((this->value_).map_)->_M_t,&((other->value_).map_)->_M_t);
      return bVar3;
    }
LAB_00128641:
    bVar3 = false;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/external/jsoncpp/src/lib_json/json_value.cpp"
                  ,0x247,"bool Json::Value::operator==(const Value &) const");
  }
  return bVar3;
}

Assistant:

ValueType Value::type() const {
  return static_cast<ValueType>(bits_.value_type_);
}